

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des3.c
# Opt level: O0

int des_ede_cfb64_cipher(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  DES_key_schedule *pDVar2;
  void *pvVar3;
  void *pvVar4;
  EVP_CIPHER_CTX *in_RCX;
  uchar *in_RDX;
  EVP_CIPHER_CTX *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  int num_1;
  int num;
  int local_28;
  int in_stack_ffffffffffffffdc;
  EVP_CIPHER_CTX *pEVar5;
  uchar *local_18;
  
  local_18 = in_RDX;
  for (; (EVP_CIPHER_CTX *)0x3fffffffffffffff < in_RCX;
      in_RCX = (EVP_CIPHER_CTX *)in_RCX[-0x590b21642c8591].buf) {
    in_stack_ffffffffffffffdc = EVP_CIPHER_CTX_get_num(in_RSI);
    pEVar5 = in_RSI;
    pDVar2 = (DES_key_schedule *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    pvVar3 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    pvVar4 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    DES_ede3_cfb64_encrypt
              (local_18,(uchar *)in_RSI,0x4000000000000000,pDVar2,
               (DES_key_schedule *)((long)pvVar3 + 0x80),(DES_key_schedule *)((long)pvVar4 + 0x100),
               (DES_cblock *)in_RDI->iv,(int *)&stack0xffffffffffffffdc,iVar1);
    EVP_CIPHER_CTX_set_num(in_RCX,in_stack_ffffffffffffffdc);
    local_18 = local_18 + 0x4000000000000000;
    in_RSI = (EVP_CIPHER_CTX *)&pEVar5[0x590b21642c8590].final_used;
  }
  if (in_RCX != (EVP_CIPHER_CTX *)0x0) {
    local_28 = EVP_CIPHER_CTX_get_num(in_RSI);
    pEVar5 = in_RCX;
    pDVar2 = (DES_key_schedule *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    pvVar3 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    pvVar4 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    DES_ede3_cfb64_encrypt
              (local_18,(uchar *)in_RSI,(long)in_RCX,pDVar2,
               (DES_key_schedule *)((long)pvVar3 + 0x80),(DES_key_schedule *)((long)pvVar4 + 0x100),
               (DES_cblock *)in_RDI->iv,&local_28,iVar1);
    EVP_CIPHER_CTX_set_num(pEVar5,in_stack_ffffffffffffffdc);
  }
  return 1;
}

Assistant:

static int des_ede_cfb64_cipher(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                const unsigned char *in, size_t inl)
{
    while (inl >= EVP_MAXCHUNK) {
        int num = EVP_CIPHER_CTX_get_num(ctx);
        DES_ede3_cfb64_encrypt(in, out, (long)EVP_MAXCHUNK,
                               &data(ctx)->ks1, &data(ctx)->ks2,
                               &data(ctx)->ks3, (DES_cblock *)ctx->iv,
                               &num, EVP_CIPHER_CTX_is_encrypting(ctx));
        EVP_CIPHER_CTX_set_num(ctx, num);
        inl -= EVP_MAXCHUNK;
        in += EVP_MAXCHUNK;
        out += EVP_MAXCHUNK;
    }
    if (inl) {
        int num = EVP_CIPHER_CTX_get_num(ctx);
        DES_ede3_cfb64_encrypt(in, out, (long)inl,
                               &data(ctx)->ks1, &data(ctx)->ks2,
                               &data(ctx)->ks3, (DES_cblock *)ctx->iv,
                               &num, EVP_CIPHER_CTX_is_encrypting(ctx));
        EVP_CIPHER_CTX_set_num(ctx, num);
    }
    return 1;
}